

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O3

void do_insr_i64(DisasContext_conflict1 *s,arg_rrr_esz *a,TCGv_i64 val)

{
  uint32_t val_00;
  TCGv_i32 pTVar1;
  TCGTemp *ts;
  TCGTemp *ts_00;
  TCGv_i64 in_RCX;
  uintptr_t o;
  
  val_00 = simd_desc_aarch64((uint32_t)s,(uint32_t)s,0);
  pTVar1 = tcg_const_i32_aarch64((TCGContext_conflict1 *)a,val_00);
  ts = tcg_temp_new_internal_aarch64((TCGContext_conflict1 *)a,TCG_TYPE_I64,false);
  ts_00 = tcg_temp_new_internal_aarch64((TCGContext_conflict1 *)a,TCG_TYPE_I64,false);
  tcg_gen_addi_i64_aarch64
            ((TCGContext_conflict1 *)a,(TCGv_i64)((long)ts - (long)a),*(TCGv_i64 *)(a + 0xa8f),
             (long)(*(int *)(val + 4) * 0x100 + 0xc10));
  tcg_gen_addi_i64_aarch64
            ((TCGContext_conflict1 *)a,(TCGv_i64)((long)ts_00 - (long)a),*(TCGv_i64 *)(a + 0xa8f),
             (long)(*(int *)(val + 0xc) * 0x100 + 0xc10));
  (*do_insr_i64::fns[*(int *)val])
            ((TCGContext_conflict1 *)a,(TCGv_ptr)((long)ts - (long)a),
             (TCGv_ptr)((long)ts_00 - (long)a),in_RCX,pTVar1);
  tcg_temp_free_internal_aarch64((TCGContext_conflict1 *)a,ts);
  tcg_temp_free_internal_aarch64((TCGContext_conflict1 *)a,ts_00);
  tcg_temp_free_internal_aarch64((TCGContext_conflict1 *)a,(TCGTemp *)(pTVar1 + (long)a));
  return;
}

Assistant:

static void do_insr_i64(DisasContext *s, arg_rrr_esz *a, TCGv_i64 val)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    typedef void gen_insr(TCGContext *, TCGv_ptr, TCGv_ptr, TCGv_i64, TCGv_i32);
    static gen_insr * const fns[4] = {
        gen_helper_sve_insr_b, gen_helper_sve_insr_h,
        gen_helper_sve_insr_s, gen_helper_sve_insr_d,
    };
    unsigned vsz = vec_full_reg_size(s);
    TCGv_i32 desc = tcg_const_i32(tcg_ctx, simd_desc(vsz, vsz, 0));
    TCGv_ptr t_zd = tcg_temp_new_ptr(tcg_ctx);
    TCGv_ptr t_zn = tcg_temp_new_ptr(tcg_ctx);

    tcg_gen_addi_ptr(tcg_ctx, t_zd, tcg_ctx->cpu_env, vec_full_reg_offset(s, a->rd));
    tcg_gen_addi_ptr(tcg_ctx, t_zn, tcg_ctx->cpu_env, vec_full_reg_offset(s, a->rn));

    fns[a->esz](tcg_ctx, t_zd, t_zn, val, desc);

    tcg_temp_free_ptr(tcg_ctx, t_zd);
    tcg_temp_free_ptr(tcg_ctx, t_zn);
    tcg_temp_free_i32(tcg_ctx, desc);
}